

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

bool Fossilize::application_info_promote_robustness2(VkApplicationInfo *app_info)

{
  char *__s2;
  int iVar1;
  bool bVar2;
  long lVar3;
  
  if ((app_info == (VkApplicationInfo *)0x0) || (__s2 = app_info->pEngineName, __s2 == (char *)0x0))
  {
    bVar2 = false;
  }
  else {
    iVar1 = strcmp("DXVK",__s2);
    if (iVar1 == 0) {
      bVar2 = true;
    }
    else {
      lVar3 = 0;
      do {
        bVar2 = lVar3 != 8;
        if (lVar3 == 8) {
          return bVar2;
        }
        iVar1 = strcmp(*(char **)((long)application_info_promote_robustness2::promote_engine_names +
                                 lVar3 + 8),__s2);
        lVar3 = lVar3 + 8;
      } while (iVar1 != 0);
    }
  }
  return bVar2;
}

Assistant:

static bool application_info_promote_robustness2(const VkApplicationInfo *app_info)
{
	if (!app_info || !app_info->pEngineName)
		return false;

	static const char *promote_engine_names[] =
	{
		"DXVK",
		"vkd3d",
	};

	for (const char *name : promote_engine_names)
		if (strcmp(name, app_info->pEngineName) == 0)
			return true;

	return false;
}